

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::emplace<QTextEdit::ExtraSelection_const&>
          (QGenericArrayOps<QTextEdit::ExtraSelection> *this,qsizetype i,ExtraSelection *args)

{
  ExtraSelection **ppEVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_98;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size == i) {
      qVar4 = QArrayDataPointer<QTextEdit::ExtraSelection>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QTextEdit::ExtraSelection>);
      if (qVar4 == 0) goto LAB_00489481;
      QTextEdit::ExtraSelection::ExtraSelection
                ((this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr +
                 (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size,args);
LAB_00489592:
      pqVar2 = &(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00489551;
    }
LAB_00489481:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QTextEdit::ExtraSelection>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QTextEdit::ExtraSelection>);
      if (qVar4 != 0) {
        QTextEdit::ExtraSelection::ExtraSelection
                  ((this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr + -1,args);
        ppEVar1 = &(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
        *ppEVar1 = *ppEVar1 + -1;
        goto LAB_00489592;
      }
    }
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextEdit::ExtraSelection::ExtraSelection((ExtraSelection *)&local_48,args);
  bVar5 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size != 0;
  QArrayDataPointer<QTextEdit::ExtraSelection>::detachAndGrow
            (&this->super_QArrayDataPointer<QTextEdit::ExtraSelection>,(uint)(i == 0 && bVar5),1,
             (ExtraSelection **)0x0,(QArrayDataPointer<QTextEdit::ExtraSelection> *)0x0);
  if (i == 0 && bVar5) {
    QTextEdit::ExtraSelection::ExtraSelection
              ((this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr + -1,
               (ExtraSelection *)&local_48);
    ppEVar1 = &(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
    *ppEVar1 = *ppEVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_98.sourceCopyConstruct = 0;
    local_98.nSource = 0;
    local_98.move = 0;
    local_98.sourceCopyAssign = 0;
    local_98.end = (ExtraSelection *)0x0;
    local_98.last = (ExtraSelection *)0x0;
    local_98.where = (ExtraSelection *)0x0;
    local_98.begin = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
    local_98.size = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
    local_98.data = &this->super_QArrayDataPointer<QTextEdit::ExtraSelection>;
    Inserter::insertOne(&local_98,i,(ExtraSelection *)&local_48);
    (local_98.data)->ptr = local_98.begin;
    (local_98.data)->size = local_98.size;
  }
  QTextEdit::ExtraSelection::~ExtraSelection((ExtraSelection *)&local_48);
LAB_00489551:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }